

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

void linsolve_lower(double *L,int N,double *b,double *x)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  uint uVar4;
  double *__ptr;
  double *col;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  
  lVar13 = (long)N;
  __ptr = (double *)malloc(lVar13 * 8);
  col = (double *)malloc(lVar13 * 8 * lVar13);
  uVar12 = (ulong)(uint)N;
  if (N < 1) {
    *__ptr = *b / *L;
    bVar3 = false;
  }
  else {
    iVar8 = 0;
    uVar9 = 0;
    do {
      __ptr[uVar9] = 0.0;
      x[uVar9] = 0.0;
      if ((L[iVar8] == 0.0) && (!NAN(L[iVar8]))) {
        printf("The Matrix system does not have a unique solution");
        exit(1);
      }
      uVar9 = uVar9 + 1;
      iVar8 = iVar8 + N + 1;
    } while (uVar12 != uVar9);
    *__ptr = *b / *L;
    bVar3 = uVar12 != 1;
    if (uVar12 == 1) {
      bVar3 = false;
    }
    else {
      pdVar6 = L + uVar12;
      uVar9 = 1;
      do {
        dVar14 = 0.0;
        uVar10 = 0;
        do {
          dVar14 = dVar14 + __ptr[uVar10] * pdVar6[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        __ptr[uVar9] = (b[uVar9] - dVar14) / L[uVar9 * uVar12 + uVar9];
        uVar9 = uVar9 + 1;
        pdVar6 = pdVar6 + uVar12;
      } while (uVar9 != uVar12);
    }
  }
  mtranspose(L,N,N,col);
  uVar4 = N - 1;
  x[(int)uVar4] = __ptr[(int)uVar4] / col[(ulong)(uint)(N * N) - 1];
  if (bVar3) {
    uVar10 = (ulong)(N + 1);
    lVar5 = (long)(N + -2);
    pdVar7 = col + lVar5 * uVar10 + 1;
    pdVar6 = x + uVar4;
    uVar9 = 1;
    do {
      dVar14 = 0.0;
      if (lVar5 < lVar13 + -1) {
        uVar11 = 0;
        do {
          pdVar1 = pdVar7 + uVar11;
          pdVar2 = pdVar6 + uVar11;
          uVar11 = uVar11 + 1;
          dVar14 = dVar14 + *pdVar1 * *pdVar2;
        } while (uVar9 != uVar11);
      }
      x[lVar5] = (__ptr[lVar5] - dVar14) / col[lVar5 * uVar10];
      lVar5 = lVar5 + -1;
      uVar9 = uVar9 + 1;
      pdVar7 = pdVar7 + -uVar10;
      pdVar6 = pdVar6 + -1;
    } while (uVar9 != uVar12);
  }
  free(__ptr);
  free(col);
  return;
}

Assistant:

void linsolve_lower(double *L,int N,double *b,double *x) {
	int i,j,c1,l;
	double *y,*A;
	double sum;
	
	y = (double*) malloc(sizeof(double) *N);
	A = (double*) malloc(sizeof(double) *N *N);
	
	for(i = 0; i < N;++i) {
		y[i] = 0.;
		x[i] = 0.;
		if ( L[i*N + i] == 0.) {
			printf("The Matrix system does not have a unique solution");
			exit(1);
		}
		//printf("\n B %d",ipiv[i]);
	}
	
	// Forward Substitution
	
	y[0] = b[0]/L[0];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * L[c1 + j];
		}
		y[i] = (b[i] - sum)/L[c1+i];
	}
	
	mtranspose(L,N,N,A);
	
	//Back Substitution
	
	x[N - 1] = y[N - 1]/A[N * N - 1];
	
	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += A[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / A[c1];
	}
	
	free(y);
	free(A);
}